

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* soul::HTMLGenerator::groupMarkdownIntoParagraphs
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *lines)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  pointer __x;
  __string_type __str;
  string trimmedLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_80 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  __x = (lines->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (lines->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != local_38) {
    bVar4 = false;
    uVar5 = 0;
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (__x->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + __x->_M_string_length);
      choc::text::trim(&local_78,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar3 = __x->_M_string_length - local_78._M_string_length;
      if (bVar4) {
        if ((local_78._M_string_length < 3) ||
           ((char)*(short *)(local_78._M_dataplus._M_p + 2) != '`' ||
            *(short *)local_78._M_dataplus._M_p != 0x6060)) {
          if ((local_78._M_string_length == 0) || (uVar5 <= uVar3)) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            pcVar2 = (__x->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar2,pcVar2 + __x->_M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
            std::__cxx11::string::_M_append
                      ((char *)(*(pointer *)(local_80 + 8) + -1),(ulong)local_a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_0026f413:
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_0026f519;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80,__x);
        }
        else {
          local_a0._M_string_length = 0;
          local_a0.field_2._M_local_buf[0] = '\0';
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_80,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                     local_a0.field_2._M_local_buf[0]) + 1);
          }
        }
        bVar4 = false;
        uVar5 = 0;
      }
      else if (local_78._M_string_length == 1) {
LAB_0026f452:
        if ((local_78._M_string_length < 3) ||
           ((char)*(short *)(local_78._M_dataplus._M_p + 2) != '`' ||
            *(short *)local_78._M_dataplus._M_p != 0x6060)) {
          if ((uVar3 < 4) || (*(long *)(*(long *)(local_80 + 8) + -0x18) != 0)) {
            if ((*(long *)(*(long *)(local_80 + 8) + -0x18) != 0) &&
               (*(__x->_M_dataplus)._M_p != ' ')) {
              std::__cxx11::string::push_back((char)*(long *)(local_80 + 8) + -0x20);
            }
            std::__cxx11::string::_M_append
                      ((char *)(*(pointer *)(local_80 + 8) + -1),(ulong)(__x->_M_dataplus)._M_p);
          }
          else {
            pcVar2 = (__x->_M_dataplus)._M_p;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar2,pcVar2 + __x->_M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_80,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            bVar4 = true;
            uVar5 = uVar3;
          }
        }
        else {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_78._M_dataplus._M_p,
                     local_78._M_dataplus._M_p + local_78._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_80,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                     local_a0.field_2._M_local_buf[0]) + 1);
          }
          bVar4 = true;
          uVar5 = 0;
        }
      }
      else if (local_78._M_string_length == 0) {
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_80,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_0026f413;
      }
      else {
        if (((*local_78._M_dataplus._M_p != '-') && (*local_78._M_dataplus._M_p != '*')) ||
           (local_78._M_dataplus._M_p[1] != ' ')) goto LAB_0026f452;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80,__x);
      }
LAB_0026f519:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      __x = __x + 1;
    } while (__x != local_38);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_80;
}

Assistant:

static std::vector<std::string> groupMarkdownIntoParagraphs (const std::vector<std::string>& lines)
    {
        std::vector<std::string> paragraphs;
        paragraphs.push_back ({});
        bool isInCodeSection = false;
        size_t codeSectionIndent = 0;

        for (auto& line : lines)
        {
            auto trimmedLine = choc::text::trim (line);
            auto leadingSpaces = line.length() - trimmedLine.length();

            if (isInCodeSection)
            {
                if (choc::text::startsWith (trimmedLine, "```"))
                {
                    isInCodeSection = false;
                    codeSectionIndent = 0;
                    paragraphs.push_back ({});
                    continue;
                }

                if (leadingSpaces >= codeSectionIndent || trimmedLine.empty())
                {
                    paragraphs.back() += line + '\n';
                    continue;
                }

                isInCodeSection = false;
                codeSectionIndent = 0;
                paragraphs.push_back (line);
                continue;
            }

            if (trimmedLine.empty())
            {
                paragraphs.push_back ({});
            }
            else if (isListMarker (trimmedLine))
            {
                paragraphs.push_back (line);
            }
            else if (choc::text::startsWith (trimmedLine, "```"))
            {
                isInCodeSection = true;
                codeSectionIndent = 0;
                paragraphs.push_back (trimmedLine + '\n');
            }
            else if (leadingSpaces >= 4 && paragraphs.back().empty())
            {
                isInCodeSection = true;
                codeSectionIndent = leadingSpaces;
                paragraphs.push_back (line + '\n');
            }
            else if (! trimmedLine.empty())
            {
                if (! (paragraphs.back().empty() || line.front() == ' '))
                    paragraphs.back() += ' ';

                paragraphs.back() += line;
            }
        }

        return paragraphs;
    }